

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::when_ready
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this,
          handler_type2 *handler)

{
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> guard;
  bool call_handler;
  shared_ptr<std::exception> *in_stack_ffffffffffffffd0;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_ffffffffffffffd8;
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar1;
  
  bVar1 = 0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,in_RDI);
  if ((in_RDI[1].super___mutex_base._M_mutex.__size[0xc] & 1U) == 0) {
    std::
    function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
    ::operator=(in_RSI,(function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
                        *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  }
  else {
    bVar1 = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x29efb5);
  if ((bVar1 & 1) != 0) {
    std::
    function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
    ::operator()(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void when_ready(const handler_type2& handler) {
        bool call_handler = false;
        {   std::lock_guard<std::mutex> guard(lock_);
            if (has_result_) call_handler = true;
            else handler2_ = handler;
        }
        if (call_handler) handler(*this, err_);
    }